

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint64 ma_dr_wav_read_pcm_frames_f32be(ma_dr_wav *pWav,ma_uint64 framesToRead,float *pBufferOut)

{
  float fVar1;
  ma_uint64 mVar2;
  long lVar3;
  long lVar4;
  
  mVar2 = ma_dr_wav_read_pcm_frames_f32(pWav,framesToRead,pBufferOut);
  if ((pBufferOut != (float *)0x0) && (lVar3 = mVar2 * pWav->channels, lVar3 != 0)) {
    lVar4 = 0;
    do {
      fVar1 = pBufferOut[lVar4];
      pBufferOut[lVar4] =
           (float)((uint)fVar1 >> 0x18 | ((uint)fVar1 & 0xff0000) >> 8 | ((uint)fVar1 & 0xff00) << 8
                  | (int)fVar1 << 0x18);
      lVar4 = lVar4 + 1;
    } while (lVar3 - lVar4 != 0);
  }
  return mVar2;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_f32be(ma_dr_wav* pWav, ma_uint64 framesToRead, float* pBufferOut)
{
    ma_uint64 framesRead = ma_dr_wav_read_pcm_frames_f32(pWav, framesToRead, pBufferOut);
    if (pBufferOut != NULL && ma_dr_wav__is_little_endian() == MA_TRUE) {
        ma_dr_wav__bswap_samples_f32(pBufferOut, framesRead*pWav->channels);
    }
    return framesRead;
}